

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::BloomFilterAlgorithm::write
          (BloomFilterAlgorithm *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *this_01;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"BloomFilterAlgorithm");
  if (((byte)this->__isset & 1) != 0) {
    __n_00 = 1;
    this_01 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"BLOCK",0xc);
    sVar4 = SplitBlockAlgorithm::write((SplitBlockAlgorithm *)this_01,__fd,__buf_00,__n_00);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t BloomFilterAlgorithm::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("BloomFilterAlgorithm");

  if (this->__isset.BLOCK) {
    xfer += oprot->writeFieldBegin("BLOCK", ::apache::thrift::protocol::T_STRUCT, 1);
    xfer += this->BLOCK.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}